

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

void Of_ManLiftCuts(Of_Man_t *p,int iObj)

{
  int iVar1;
  int *piVar2;
  int *pList;
  int *pCut;
  int local_18;
  int k;
  int i;
  int iObj_local;
  Of_Man_t *p_local;
  
  piVar2 = Of_ObjCutSet(p,iObj);
  iVar1 = Of_ObjHasCuts(p,iObj);
  if (iVar1 != 0) {
    local_18 = 0;
    pList = piVar2 + 1;
    while (local_18 < *piVar2) {
      pCut._4_4_ = 1;
      while( true ) {
        iVar1 = Of_CutSize(pList);
        if (iVar1 < pCut._4_4_) break;
        iVar1 = Abc_Var2Lit(pList[pCut._4_4_],0);
        pList[pCut._4_4_] = iVar1;
        pCut._4_4_ = pCut._4_4_ + 1;
      }
      local_18 = local_18 + 1;
      iVar1 = Of_CutSize(pList);
      pList = pList + (iVar1 + 4);
    }
    return;
  }
  __assert_fail("Of_ObjHasCuts(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                ,0x19e,"void Of_ManLiftCuts(Of_Man_t *, int)");
}

Assistant:

static inline void Of_ManLiftCuts( Of_Man_t * p, int iObj )
{
    int i, k, * pCut, * pList = Of_ObjCutSet(p, iObj);
    assert( Of_ObjHasCuts(p, iObj) );
    Of_SetForEachCut( pList, pCut, i )
    {
        for ( k = 1; k <= Of_CutSize(pCut); k++ )
            pCut[k] = Abc_Var2Lit(pCut[k], 0);
    }
}